

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

void __thiscall
Inline::FillInlineesDataArrayUsingFixedMethods
          (Inline *this,FunctionJITTimeInfo *inlineeJitTimeData,
          FunctionJITTimeInfo **inlineesDataArray,uint inlineesDataArrayLength,
          FixedFieldInfo *fixedFieldInfoArray,uint16 cachedFixedInlineeCount)

{
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *this_00;
  intptr_t iVar7;
  FunctionJITTimeInfo *pFVar8;
  intptr_t iVar9;
  char16 *pcVar10;
  char16 *pcVar11;
  undefined2 in_register_0000008a;
  uint16 i;
  ulong uVar12;
  FixedFieldInfo *this_01;
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  
  unique0x10000295 = fixedFieldInfoArray;
  if (inlineesDataArrayLength < CONCAT22(in_register_0000008a,cachedFixedInlineeCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x2aa,"(cachedFixedInlineeCount <= inlineesDataArrayLength)",
                       "cachedFixedInlineeCount <= inlineesDataArrayLength");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  do {
    if (inlineeJitTimeData == (FunctionJITTimeInfo *)0x0) {
      return;
    }
    bVar3 = FunctionJITTimeInfo::HasBody(inlineeJitTimeData);
    if (bVar3) {
      this_00 = FunctionJITTimeInfo::GetBody(inlineeJitTimeData);
      uVar4 = FunctionJITTimeInfo::GetSourceContextId(inlineeJitTimeData);
      uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(inlineeJitTimeData);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,PolymorphicInlinePhase,uVar4,uVar5);
      if (!bVar3) {
        uVar4 = FunctionJITTimeInfo::GetSourceContextId(inlineeJitTimeData);
        uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(inlineeJitTimeData);
        bVar3 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01441eb0,PolymorphicInlineFixedMethodsPhase,uVar4,uVar5);
        if (!bVar3) {
          iVar7 = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineeJitTimeData);
          pFVar8 = FunctionJITTimeInfo::GetJitTimeDataFromFunctionInfoAddr(inlineeJitTimeData,iVar7)
          ;
          if (pFVar8 == (FunctionJITTimeInfo *)0x0) {
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
            if (bVar3) {
              pcVar10 = JITTimeFunctionBody::GetDisplayName(this_00);
              pcVar11 = FunctionJITTimeInfo::GetDebugNumberSet
                                  (inlineeJitTimeData,(wchar (*) [42])local_a8);
              Output::Print(L"INLINING (Polymorphic): Missing jit time data skipped inlinee\tInlinee: %s (%s)\n"
                            ,pcVar10,pcVar11);
              Output::Flush();
            }
          }
          else {
            uVar2 = 0;
            this_01 = stack0xffffffffffffffb0;
            do {
              uVar12 = uVar2;
              if (cachedFixedInlineeCount == uVar12) goto LAB_005025ec;
              iVar7 = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineeJitTimeData);
              iVar9 = FixedFieldInfo::GetFuncInfoAddr(this_01);
              this_01 = this_01 + 1;
              uVar2 = uVar12 + 1;
            } while (iVar7 != iVar9);
            iVar7 = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineeJitTimeData);
            pFVar8 = FunctionJITTimeInfo::GetJitTimeDataFromFunctionInfoAddr
                               (inlineeJitTimeData,iVar7);
            inlineesDataArray[uVar12] = pFVar8;
          }
        }
      }
    }
LAB_005025ec:
    inlineeJitTimeData = FunctionJITTimeInfo::GetNext(inlineeJitTimeData);
  } while( true );
}

Assistant:

void Inline::FillInlineesDataArrayUsingFixedMethods(
    const FunctionJITTimeInfo* inlineeJitTimeData,
        __inout_ecount(inlineesDataArrayLength) const FunctionJITTimeInfo ** inlineesDataArray,
        uint inlineesDataArrayLength,
        __inout_ecount(cachedFixedInlineeCount) FixedFieldInfo* fixedFieldInfoArray,
        uint16 cachedFixedInlineeCount
        )
{
    AnalysisAssert(cachedFixedInlineeCount <= inlineesDataArrayLength);

    JITTimeFunctionBody* inlineeFuncBody = nullptr;
    while (inlineeJitTimeData)
    {
        if (inlineeJitTimeData->HasBody())
        {
             inlineeFuncBody = inlineeJitTimeData->GetBody();
            if (!PHASE_OFF(Js::PolymorphicInlinePhase, inlineeJitTimeData) && !PHASE_OFF(Js::PolymorphicInlineFixedMethodsPhase, inlineeJitTimeData))
            {
                const FunctionJITTimeInfo * jitTimeData = inlineeJitTimeData->GetJitTimeDataFromFunctionInfoAddr(inlineeJitTimeData->GetFunctionInfoAddr());
                if (jitTimeData)
                {
                    for (uint16 i = 0; i < cachedFixedInlineeCount; i++)
                    {
                        if (inlineeJitTimeData->GetFunctionInfoAddr() == fixedFieldInfoArray[i].GetFuncInfoAddr())
                        {
                            inlineesDataArray[i] = inlineeJitTimeData->GetJitTimeDataFromFunctionInfoAddr(inlineeJitTimeData->GetFunctionInfoAddr());
                            break;
                        }
                    }
                }
                else
                {
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
                    POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Missing jit time data skipped inlinee\tInlinee: %s (%s)\n"),
                                inlineeFuncBody->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer));
                }
            }
        }
        inlineeJitTimeData = inlineeJitTimeData->GetNext();
    }
}